

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VM.cpp
# Opt level: O1

void __thiscall luna::VM::Execute(VM *this)

{
  State *pSVar1;
  
  if ((this->state_->calls_).super__List_base<luna::CallInfo,_std::allocator<luna::CallInfo>_>.
      _M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)&this->state_->calls_) {
    __assert_fail("!state_->calls_.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/VM.cpp",
                  0x32,"void luna::VM::Execute()");
  }
  while ((pSVar1 = this->state_,
         (pSVar1->calls_).super__List_base<luna::CallInfo,_std::allocator<luna::CallInfo>_>._M_impl.
         _M_node.super__List_node_base._M_next != (_List_node_base *)&pSVar1->calls_ &&
         (*(int *)&((pSVar1->calls_).
                    super__List_base<luna::CallInfo,_std::allocator<luna::CallInfo>_>._M_impl.
                    _M_node.super__List_node_base._M_prev[1]._M_prev)->_M_prev != 9))) {
    ExecuteFrame(this);
  }
  return;
}

Assistant:

void VM::Execute()
    {
        assert(!state_->calls_.empty());

        while (!state_->calls_.empty())
        {
            // If current stack frame is a frame of a c function,
            // do not continue execute instructions, just return
            if (state_->calls_.back().func_->type_ == ValueT_CFunction)
                return ;
            ExecuteFrame();
        }
    }